

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

int Gia_ManInseHighestScore(Gia_Man_t *p,int *pCost)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int *__ptr;
  Gia_Obj_t *pObj;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  size_t __nmemb;
  
  __nmemb = (long)p->iData * 0x40;
  __ptr = (int *)calloc(__nmemb,4);
  uVar11 = 1;
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pObj = Gia_ManCo(p,(iVar7 - p->nRegs) + p->vCos->nSize);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjId(p,pObj);
    uVar1 = p->iData;
    pvVar2 = p->pData;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      uVar3 = *(ulong *)((long)pvVar2 + uVar9 * 8 + (long)(int)(iVar4 * uVar1 * 2) * 8);
      for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
        uVar10 = 1;
        if ((uVar3 >> (uVar6 & 0x3f) & 1) == 0) {
          uVar10 = (uint)((*(ulong *)((long)pvVar2 +
                                     uVar9 * 8 +
                                     (long)(int)uVar1 * 8 + (long)(int)(iVar4 * uVar1 * 2) * 8) &
                          1L << ((byte)uVar6 & 0x3f)) != 0);
        }
        __ptr[(ulong)((uint)uVar9 & 0x3ffffff) * 0x40 + uVar6] =
             __ptr[(ulong)((uint)uVar9 & 0x3ffffff) * 0x40 + uVar6] + uVar10;
      }
    }
  }
  uVar8 = 0;
  iVar7 = *__ptr;
  for (; (long)uVar11 < (long)__nmemb; uVar11 = uVar11 + 1) {
    iVar4 = __ptr[uVar11];
    iVar5 = iVar7;
    if (iVar7 <= iVar4) {
      iVar5 = iVar4;
    }
    if (iVar7 < iVar4) {
      uVar8 = uVar11 & 0xffffffff;
    }
    iVar7 = iVar5;
  }
  *pCost = p->nRegs - iVar7;
  free(__ptr);
  return (int)uVar8;
}

Assistant:

int Gia_ManInseHighestScore( Gia_Man_t * p, int * pCost )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int * pCounts, CountBest;
    int i, k, b, nPats, iPat;
    nPats = 64 * p->iData;
    pCounts = ABC_CALLOC( int, nPats );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            for ( b = 0; b < 64; b++ )
                pCounts[64*i+b] += (((pData0[i] >> b) & 1) || ((pData1[i] >> b) & 1)); // binary
    }
    iPat = 0;
    CountBest = pCounts[0]; 
    for ( k = 1; k < nPats; k++ )
        if ( CountBest < pCounts[k] )
            CountBest = pCounts[k], iPat = k;
    *pCost = Gia_ManRegNum(p) - CountBest; // ternary
    ABC_FREE( pCounts );
    return iPat;
}